

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 12_string_object.cpp
# Opt level: O2

int input_and_output_lines(void)

{
  undefined1 *puVar1;
  long lVar2;
  undefined *apuStack_e8 [2];
  string list [5];
  
  lVar2 = 0x10;
  do {
    puVar1 = (undefined1 *)((long)&list[0]._M_dataplus._M_p + lVar2);
    *(undefined1 **)((long)apuStack_e8 + lVar2) = puVar1;
    *(undefined8 *)((long)list + lVar2 + -8) = 0;
    *puVar1 = 0;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0xb0);
  apuStack_e8[1] = &UNK_00109811;
  std::operator<<((ostream *)&std::cout,"Enter your ");
}

Assistant:

int input_and_output_lines () {
    using namespace std;
    string list[SIZE];
    cout << "Enter your " << SIZE << " favorite fruit name: \n";
    for (int i = 0; i < SIZE; i++) {
        cout << i + 1 << " :";
        //  从输入流 CIN 中取一行，写入字符串地址
        getline(cin, list[i]);
    }
    cout << "Here's what you input:\n";
    display_all_strings(list, SIZE);
}